

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_BlindTransaction_Test::TestBody
          (cfdcapi_elements_transaction_BlindTransaction_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar_50;
  AssertionResult gtest_ar_49;
  AssertionResult gtest_ar_48;
  AssertionResult gtest_ar_47;
  AssertionResult gtest_ar_46;
  AssertionResult gtest_ar_45;
  AssertionResult gtest_ar_44;
  AssertionResult gtest_ar_43;
  AssertionResult gtest_ar_42;
  AssertionResult gtest_ar_41;
  AssertionResult gtest_ar_40;
  AssertionResult gtest_ar_39;
  AssertionResult gtest_ar_38;
  AssertionResult gtest_ar_37;
  AssertionResult gtest_ar_36;
  AssertionResult gtest_ar_35;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  char *token_value_blind_factor;
  char *token_blind_factor;
  int64_t token_value;
  char *token;
  char *asset_value_blind_factor;
  int64_t asset_value;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  char *empty_factor;
  bool is_issuance_token;
  bool is_issuance_asset;
  uint32_t issuance_vout;
  char *issuance_txid;
  char *value_blind_factor;
  char *asset_blind_factor;
  char *asset;
  int64_t value;
  uint32_t vout;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *blind_handle;
  int64_t satoshi;
  char *tx_string;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff148;
  AssertionResult *pAVar6;
  undefined1 *puVar7;
  AssertionResult *in_stack_fffffffffffff150;
  char *in_stack_fffffffffffff158;
  char *in_stack_fffffffffffff160;
  void **in_stack_fffffffffffff168;
  void *in_stack_fffffffffffff1d0;
  AssertionResult *pAVar8;
  undefined7 in_stack_fffffffffffff1d8;
  undefined1 in_stack_fffffffffffff1df;
  int64_t in_stack_fffffffffffff210;
  undefined8 in_stack_fffffffffffff218;
  int key;
  undefined7 in_stack_fffffffffffff220;
  undefined1 in_stack_fffffffffffff227;
  void *in_stack_fffffffffffff228;
  char *in_stack_fffffffffffff2e8;
  void *in_stack_fffffffffffff2f0;
  undefined7 in_stack_fffffffffffff2f8;
  undefined1 in_stack_fffffffffffff2ff;
  char *in_stack_fffffffffffff300;
  undefined8 in_stack_fffffffffffff308;
  uint32_t index;
  undefined7 in_stack_fffffffffffff310;
  undefined1 in_stack_fffffffffffff317;
  void *in_stack_fffffffffffff318;
  int64_t *in_stack_fffffffffffff3e0;
  AssertionResult *in_stack_fffffffffffff3e8;
  undefined7 in_stack_fffffffffffff3f0;
  undefined1 in_stack_fffffffffffff3f7;
  undefined8 in_stack_fffffffffffff3f8;
  uint32_t index_00;
  AssertionResult *in_stack_fffffffffffff400;
  undefined7 in_stack_fffffffffffff408;
  undefined1 in_stack_fffffffffffff40f;
  undefined7 in_stack_fffffffffffff420;
  undefined1 in_stack_fffffffffffff427;
  char **in_stack_fffffffffffff428;
  AssertionResult *in_stack_fffffffffffff430;
  undefined7 in_stack_fffffffffffff438;
  undefined1 in_stack_fffffffffffff43f;
  bool *in_stack_fffffffffffff440;
  AssertionResult *in_stack_fffffffffffff448;
  AssertionResult *in_stack_fffffffffffff460;
  undefined7 in_stack_fffffffffffff468;
  undefined1 in_stack_fffffffffffff46f;
  char *in_stack_fffffffffffff470;
  undefined8 in_stack_fffffffffffff478;
  AssertionResult *this_00;
  uint32_t tx_out_index;
  undefined7 in_stack_fffffffffffff480;
  undefined1 in_stack_fffffffffffff487;
  AssertionResult *in_stack_fffffffffffff488;
  undefined7 in_stack_fffffffffffff4a0;
  undefined1 in_stack_fffffffffffff4a7;
  char **in_stack_fffffffffffff4a8;
  AssertionResult *in_stack_fffffffffffff630;
  undefined7 in_stack_fffffffffffff638;
  undefined1 in_stack_fffffffffffff63f;
  char *in_stack_fffffffffffff640;
  undefined8 in_stack_fffffffffffff648;
  uint32_t tx_in_index;
  undefined7 in_stack_fffffffffffff650;
  undefined1 in_stack_fffffffffffff657;
  char *in_stack_fffffffffffff658;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffff678;
  char **in_stack_fffffffffffff680;
  undefined7 in_stack_fffffffffffff690;
  AssertHelper in_stack_fffffffffffff698;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff6a0;
  AssertionResult local_950;
  AssertHelper local_940;
  Message local_938;
  undefined4 local_92c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff6e0;
  AssertHelper in_stack_fffffffffffff6e8;
  uint32_t in_stack_fffffffffffff6f4;
  char *in_stack_fffffffffffff6f8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff700;
  AssertHelper in_stack_fffffffffffff708;
  Message local_8f0 [2];
  char *in_stack_fffffffffffff720;
  AssertHelper in_stack_fffffffffffff728;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff730;
  char *in_stack_fffffffffffff738;
  AssertHelper local_8b8;
  Message local_8b0;
  undefined4 local_8a4;
  AssertionResult local_8a0;
  AssertHelper local_890;
  Message local_888;
  AssertionResult local_880;
  AssertHelper local_870;
  Message local_868;
  AssertionResult local_860;
  AssertHelper local_850;
  Message local_848;
  undefined4 local_83c;
  AssertionResult local_838;
  AssertHelper local_828;
  Message local_820;
  AssertionResult local_818;
  AssertHelper local_808;
  Message local_800;
  undefined4 local_7f4;
  AssertionResult local_7f0;
  AssertHelper local_7e0;
  Message local_7d8;
  AssertionResult local_7d0;
  AssertHelper local_7c0;
  Message local_7b8;
  AssertionResult local_7b0;
  AssertHelper local_7a0;
  Message local_798;
  undefined4 local_78c;
  AssertionResult local_788;
  AssertHelper local_778;
  Message local_770;
  AssertionResult local_768;
  AssertHelper local_758;
  Message local_750;
  undefined4 local_744;
  AssertionResult local_740;
  AssertHelper local_730;
  Message local_728;
  undefined4 local_71c;
  AssertionResult local_718;
  AssertHelper local_708;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff900;
  char *in_stack_fffffffffffff908;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff910;
  AssertHelper in_stack_fffffffffffff918;
  Message local_6e0;
  AssertionResult local_6d8;
  AssertHelper local_6c8;
  Message local_6c0;
  undefined4 local_6b4;
  AssertionResult local_6b0;
  AssertHelper local_6a0;
  Message local_698;
  AssertionResult local_690;
  AssertHelper local_680;
  Message local_678;
  undefined4 local_66c;
  AssertionResult local_668;
  undefined8 local_658;
  undefined8 local_650;
  void *local_648;
  char local_640 [8];
  char *local_638;
  undefined1 local_630 [8];
  AssertHelper local_628;
  Message local_620;
  undefined4 local_614;
  AssertionResult local_610;
  string local_600;
  AssertHelper local_5e0;
  Message local_5d8;
  byte local_5c9;
  AssertionResult local_5c8;
  string local_5b8;
  AssertHelper local_598;
  Message local_590;
  byte local_581;
  AssertionResult local_580;
  AssertHelper local_570;
  Message local_568;
  undefined4 local_55c;
  AssertionResult local_558;
  AssertHelper local_548;
  Message local_540;
  AssertionResult local_538;
  AssertHelper local_528;
  Message local_520;
  AssertionResult local_518;
  AssertHelper local_508;
  Message local_500;
  AssertionResult local_4f8;
  AssertHelper local_4e8;
  Message local_4e0;
  undefined4 local_4d4;
  AssertionResult local_4d0;
  AssertHelper local_4c0;
  Message local_4b8;
  AssertionResult local_4b0;
  AssertHelper local_4a0;
  Message local_498;
  undefined4 local_48c;
  AssertionResult local_488;
  AssertHelper local_478;
  Message local_470;
  undefined4 local_464;
  AssertionResult local_460;
  string local_450;
  AssertHelper local_430;
  Message local_428;
  byte local_419;
  AssertionResult local_418;
  string local_408;
  AssertHelper local_3e8;
  Message local_3e0;
  AssertionResult local_3d8;
  AssertHelper local_3c8;
  Message local_3c0;
  undefined4 local_3b4;
  AssertionResult local_3b0;
  AssertHelper local_3a0;
  Message local_398;
  AssertionResult local_390;
  AssertHelper local_380;
  Message local_378;
  AssertionResult local_370;
  AssertHelper local_360;
  Message local_358;
  AssertionResult local_350;
  AssertHelper local_340;
  Message local_338;
  undefined4 local_32c;
  AssertionResult local_328;
  AssertHelper local_318;
  Message local_310;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined4 local_2bc;
  AssertionResult local_2b8;
  char *local_2a8;
  byte local_29e;
  byte local_29d;
  char local_29c [4];
  char *local_298;
  char *local_290;
  AssertionResult local_288;
  char local_278 [12];
  undefined4 local_26c;
  AssertHelper local_268;
  Message local_260;
  undefined4 local_254;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  undefined4 local_204;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined4 local_1b4;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198;
  undefined4 local_18c;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_13c;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  AssertionResult local_110;
  AssertHelper local_100;
  Message local_f8;
  undefined4 local_ec;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  long local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  tx_out_index = (uint32_t)((ulong)in_stack_fffffffffffff478 >> 0x20);
  tx_in_index = (uint32_t)((ulong)in_stack_fffffffffffff648 >> 0x20);
  index_00 = (uint32_t)((ulong)in_stack_fffffffffffff3f8 >> 0x20);
  key = (int)((ulong)in_stack_fffffffffffff218 >> 0x20);
  index = (uint32_t)((ulong)in_stack_fffffffffffff308 >> 0x20);
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff168);
  local_2c = 0;
  pAVar8 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
             (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    in_stack_fffffffffffff680 =
         (char **)testing::AssertionResult::failure_message((AssertionResult *)0x34237a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x30f,(char *)in_stack_fffffffffffff680);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3423dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x342432);
  local_61 = local_10 != 0;
  this_01 = &local_60;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff150,in_stack_fffffffffffff148,(type *)0x342466);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x310,pcVar4);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x342562);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3425dd);
  local_a0 = 0;
  local_b0 = 0;
  local_14 = CfdInitializeBlindTx
                       (in_stack_fffffffffffff228,
                        (void **)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
  local_c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
             (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar3) {
    testing::Message::Message(&local_d0);
    in_stack_fffffffffffff658 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3426be);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x318,in_stack_fffffffffffff658);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x342721);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x342779);
  if (local_14 == 0) {
    local_a8 = 0x3b9542b0;
    in_stack_fffffffffffff150 = (AssertionResult *)0x3b9542b0;
    in_stack_fffffffffffff160 = (char *)0x0;
    in_stack_fffffffffffff158 = (char *)0x0;
    local_14 = CfdAddBlindTxInData(in_stack_fffffffffffff708.data_,in_stack_fffffffffffff700.ptr_,
                                   in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4,
                                   (char *)in_stack_fffffffffffff6e8.data_,
                                   (char *)in_stack_fffffffffffff6e0.ptr_,in_stack_fffffffffffff720,
                                   (int64_t)in_stack_fffffffffffff728.data_,
                                   (char *)in_stack_fffffffffffff730.ptr_,in_stack_fffffffffffff738)
    ;
    local_ec = 0;
    pAVar6 = &local_e8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    in_stack_fffffffffffff657 = testing::AssertionResult::operator_cast_to_bool(pAVar6);
    tx_in_index = (uint32_t)((ulong)pAVar6 >> 0x20);
    if (!(bool)in_stack_fffffffffffff657) {
      testing::Message::Message(&local_f8);
      in_stack_fffffffffffff640 =
           testing::AssertionResult::failure_message((AssertionResult *)0x34289c);
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x323,in_stack_fffffffffffff640);
      testing::internal::AssertHelper::operator=(&local_100,&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      testing::Message::~Message((Message *)0x3428ff);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x342954);
  }
  if (local_14 == 0) {
    local_a8 = 700000000;
    in_stack_fffffffffffff160 = "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f";
    in_stack_fffffffffffff158 = "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f";
    in_stack_fffffffffffff150 = (AssertionResult *)0x29b92700;
    local_14 = CfdAddBlindTxInData(in_stack_fffffffffffff708.data_,in_stack_fffffffffffff700.ptr_,
                                   in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f4,
                                   (char *)in_stack_fffffffffffff6e8.data_,
                                   (char *)in_stack_fffffffffffff6e0.ptr_,in_stack_fffffffffffff720,
                                   (int64_t)in_stack_fffffffffffff728.data_,
                                   (char *)in_stack_fffffffffffff730.ptr_,in_stack_fffffffffffff738)
    ;
    local_114 = 0;
    in_stack_fffffffffffff630 = &local_110;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    in_stack_fffffffffffff63f =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff630);
    if (!(bool)in_stack_fffffffffffff63f) {
      testing::Message::Message(&local_120);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x342a7b);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x330,pcVar4);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x342ade);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x342b33);
  }
  if (local_14 == 0) {
    local_14 = CfdAddBlindTxOutData
                         (in_stack_fffffffffffff318,
                          (void *)CONCAT17(in_stack_fffffffffffff317,in_stack_fffffffffffff310),
                          index,in_stack_fffffffffffff300);
    local_13c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar3) {
      testing::Message::Message(&local_148);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x342c15);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x337,pcVar4);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::Message::~Message((Message *)0x342c78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x342ccd);
  }
  if (local_14 == 0) {
    local_14 = CfdAddBlindTxOutData
                         (in_stack_fffffffffffff318,
                          (void *)CONCAT17(in_stack_fffffffffffff317,in_stack_fffffffffffff310),
                          index,in_stack_fffffffffffff300);
    local_164 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_160);
    if (!bVar3) {
      testing::Message::Message(&local_170);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x342db2);
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x33e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_178,&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      testing::Message::~Message((Message *)0x342e15);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x342e6a);
  }
  if (local_14 == 0) {
    local_14 = CfdAddBlindTxOutByAddress
                         ((void *)CONCAT17(in_stack_fffffffffffff2ff,in_stack_fffffffffffff2f8),
                          in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
    local_18c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar3) {
      testing::Message::Message(&local_198);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x342f4a);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x345,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      testing::Message::~Message((Message *)0x342fad);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x343002);
  }
  if (local_14 == 0) {
    local_14 = CfdSetBlindTxOption(in_stack_fffffffffffff228,
                                   (void *)CONCAT17(in_stack_fffffffffffff227,
                                                    in_stack_fffffffffffff220),key,
                                   in_stack_fffffffffffff210);
    local_1b4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
    if (!bVar3) {
      testing::Message::Message(&local_1c0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3430e5);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x34b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      testing::Message::~Message((Message *)0x343148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34319d);
  }
  if (local_14 == 0) {
    local_14 = CfdSetBlindTxOption(in_stack_fffffffffffff228,
                                   (void *)CONCAT17(in_stack_fffffffffffff227,
                                                    in_stack_fffffffffffff220),key,
                                   in_stack_fffffffffffff210);
    local_1dc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
    if (!bVar3) {
      testing::Message::Message(&local_1e8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x34327f);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x351,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::Message::~Message((Message *)0x3432e2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x343337);
  }
  if (local_14 == 0) {
    local_14 = CfdSetBlindTxOption(in_stack_fffffffffffff228,
                                   (void *)CONCAT17(in_stack_fffffffffffff227,
                                                    in_stack_fffffffffffff220),key,
                                   in_stack_fffffffffffff210);
    local_204 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_200);
    if (!bVar3) {
      testing::Message::Message(&local_210);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x34341a);
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x357,pcVar4);
      testing::internal::AssertHelper::operator=(&local_218,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      testing::Message::~Message((Message *)0x34347d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3434d2);
  }
  if (local_14 == 0) {
    local_14 = CfdSetBlindTxOption(in_stack_fffffffffffff228,
                                   (void *)CONCAT17(in_stack_fffffffffffff227,
                                                    in_stack_fffffffffffff220),key,
                                   in_stack_fffffffffffff210);
    local_22c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar3) {
      testing::Message::Message(&local_238);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3435b5);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x35d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x343618);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34366d);
  }
  if (local_14 == 0) {
    local_14 = CfdFinalizeBlindTx(in_stack_fffffffffffff918.data_,in_stack_fffffffffffff910.ptr_,
                                  in_stack_fffffffffffff908,(char **)in_stack_fffffffffffff900.ptr_)
    ;
    local_254 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_250);
    if (!bVar3) {
      testing::Message::Message(&local_260);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x343755);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x362,pcVar4);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message((Message *)0x3437b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34380d);
  }
  local_26c = 0;
  local_278[0] = '\0';
  local_278[1] = '\0';
  local_278[2] = '\0';
  local_278[3] = '\0';
  local_278[4] = '\0';
  local_278[5] = '\0';
  local_278[6] = '\0';
  local_278[7] = '\0';
  local_288.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_288._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_290 = (char *)0x0;
  local_298 = (char *)0x0;
  local_29c[0] = '\0';
  local_29c[1] = '\0';
  local_29c[2] = '\0';
  local_29c[3] = '\0';
  local_29d = 0;
  local_29e = 0;
  local_2a8 = "0000000000000000000000000000000000000000000000000000000000000000";
  if (local_14 == 0) {
    in_stack_fffffffffffff168 = (void **)&local_29d;
    in_stack_fffffffffffff160 = local_29c;
    in_stack_fffffffffffff158 = (char *)&local_298;
    in_stack_fffffffffffff150 = (AssertionResult *)&local_290;
    pAVar6 = &local_288;
    pcVar4 = local_278;
    local_14 = CfdGetBlindTxBlindData
                         ((void *)CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),
                          in_stack_fffffffffffff400,index_00,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff3f7,in_stack_fffffffffffff3f0),
                          (char **)in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0,
                          (char **)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                          in_stack_fffffffffffff428,(char **)in_stack_fffffffffffff430,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff43f,in_stack_fffffffffffff438),
                          in_stack_fffffffffffff440,&in_stack_fffffffffffff448->success_);
    local_2bc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
    if (!bVar3) {
      testing::Message::Message(&local_2c8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3439bb);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x376,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      testing::Message::~Message((Message *)0x343a1e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x343a76);
    if (local_14 == 0) {
      local_2e4 = 1;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(uint *)in_stack_fffffffffffff150);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
      if (!bVar3) {
        testing::Message::Message(&local_2f0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x343b31);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x379,pcVar5);
        testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
        testing::internal::AssertHelper::~AssertHelper(&local_2f8);
        testing::Message::~Message((Message *)0x343b94);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x343be9);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_308,
                 "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"","asset",
                 "accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",
                 (char *)local_288.message_.ptr_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_308);
      if (!bVar3) {
        testing::Message::Message(&local_310);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x343c8a);
        testing::internal::AssertHelper::AssertHelper
                  (&local_318,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x37a,pcVar5);
        testing::internal::AssertHelper::operator=(&local_318,&local_310);
        testing::internal::AssertHelper::~AssertHelper(&local_318);
        testing::Message::~Message((Message *)0x343ced);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x343d42);
      local_32c = 600000000;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(long *)in_stack_fffffffffffff150);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_328);
      if (!bVar3) {
        testing::Message::Message(&local_338);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x343def);
        testing::internal::AssertHelper::AssertHelper
                  (&local_340,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x37b,pcVar5);
        testing::internal::AssertHelper::operator=(&local_340,&local_338);
        testing::internal::AssertHelper::~AssertHelper(&local_340);
        testing::Message::~Message((Message *)0x343e52);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x343ea7);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_350,"empty_factor","asset_blind_factor",local_2a8,
                 (char *)local_288._0_8_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_350);
      if (!bVar3) {
        testing::Message::Message(&local_358);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x343f49);
        testing::internal::AssertHelper::AssertHelper
                  (&local_360,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x37c,pcVar5);
        testing::internal::AssertHelper::operator=(&local_360,&local_358);
        testing::internal::AssertHelper::~AssertHelper(&local_360);
        testing::Message::~Message((Message *)0x343fac);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x344001);
      testing::internal::CmpHelperSTRNE
                ((internal *)&local_370,"empty_factor","value_blind_factor",local_2a8,local_290);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_370);
      if (!bVar3) {
        testing::Message::Message(&local_378);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3440a3);
        testing::internal::AssertHelper::AssertHelper
                  (&local_380,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x37d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_380,&local_378);
        testing::internal::AssertHelper::~AssertHelper(&local_380);
        testing::Message::~Message((Message *)0x344106);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34415b);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_390,
                 "\"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f\"",
                 "issuance_txid","57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",
                 local_298);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_390);
      if (!bVar3) {
        testing::Message::Message(&local_398);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3441fc);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x37f,pcVar5);
        testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
        testing::internal::AssertHelper::~AssertHelper(&local_3a0);
        testing::Message::~Message((Message *)0x34425f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3442b4);
      local_3b4 = 1;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(uint *)in_stack_fffffffffffff150);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
      if (!bVar3) {
        testing::Message::Message(&local_3c0);
        in_stack_fffffffffffff4a8 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x344361);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x380,(char *)in_stack_fffffffffffff4a8);
        testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
        testing::internal::AssertHelper::~AssertHelper(&local_3c8);
        testing::Message::~Message((Message *)0x3443c4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x344419);
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffff150,&pAVar6->success_,(type *)0x34443a);
      in_stack_fffffffffffff4a7 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
      if (!(bool)in_stack_fffffffffffff4a7) {
        testing::Message::Message(&local_3e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_408,(internal *)&local_3d8,(AssertionResult *)"is_issuance_asset","false",
                   "true",pcVar4);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x381,pcVar5);
        testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
        testing::internal::AssertHelper::~AssertHelper(&local_3e8);
        std::__cxx11::string::~string((string *)&local_408);
        testing::Message::~Message((Message *)0x344536);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3445ae);
      local_419 = ~local_29e & 1;
      in_stack_fffffffffffff488 = &local_418;
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffff150,&pAVar6->success_,(type *)0x3445e1);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff488);
      if (!bVar3) {
        testing::Message::Message(&local_428);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_450,(internal *)&local_418,(AssertionResult *)"is_issuance_token","true",
                   "false",pcVar4);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_430,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x382,pcVar4);
        testing::internal::AssertHelper::operator=(&local_430,&local_428);
        testing::internal::AssertHelper::~AssertHelper(&local_430);
        std::__cxx11::string::~string((string *)&local_450);
        testing::Message::~Message((Message *)0x3446dd);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x344755);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      local_288.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_288._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_290 = (char *)0x0;
      local_298 = (char *)0x0;
    }
  }
  if (local_14 == 0) {
    in_stack_fffffffffffff168 = (void **)&local_29d;
    in_stack_fffffffffffff160 = local_29c;
    in_stack_fffffffffffff158 = (char *)&local_298;
    in_stack_fffffffffffff150 = (AssertionResult *)&local_290;
    pAVar6 = &local_288;
    local_14 = CfdGetBlindTxBlindData
                         ((void *)CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),
                          in_stack_fffffffffffff400,index_00,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff3f7,in_stack_fffffffffffff3f0),
                          (char **)in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0,
                          (char **)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                          in_stack_fffffffffffff428,(char **)in_stack_fffffffffffff430,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff43f,in_stack_fffffffffffff438),
                          in_stack_fffffffffffff440,&in_stack_fffffffffffff448->success_);
    local_464 = 0;
    this_00 = &local_460;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    in_stack_fffffffffffff487 = testing::AssertionResult::operator_cast_to_bool(this_00);
    tx_out_index = (uint32_t)((ulong)this_00 >> 0x20);
    if (!(bool)in_stack_fffffffffffff487) {
      testing::Message::Message(&local_470);
      in_stack_fffffffffffff470 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3448fb);
      testing::internal::AssertHelper::AssertHelper
                (&local_478,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x393,in_stack_fffffffffffff470);
      testing::internal::AssertHelper::operator=(&local_478,&local_470);
      testing::internal::AssertHelper::~AssertHelper(&local_478);
      testing::Message::~Message((Message *)0x34495e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3449b6);
    if (local_14 == 0) {
      local_48c = 1;
      in_stack_fffffffffffff460 = &local_488;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(uint *)in_stack_fffffffffffff150);
      in_stack_fffffffffffff46f =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff460);
      if (!(bool)in_stack_fffffffffffff46f) {
        testing::Message::Message(&local_498);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x344a71);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x396,pcVar4);
        testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
        testing::internal::AssertHelper::~AssertHelper(&local_4a0);
        testing::Message::~Message((Message *)0x344ad4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x344b29);
      in_stack_fffffffffffff448 = &local_4b0;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffff448,
                 "\"ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b\"","asset",
                 "ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b",
                 (char *)local_288.message_.ptr_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff448);
      if (!bVar3) {
        testing::Message::Message(&local_4b8);
        in_stack_fffffffffffff440 =
             (bool *)testing::AssertionResult::failure_message((AssertionResult *)0x344bca);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x397,in_stack_fffffffffffff440);
        testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
        testing::internal::AssertHelper::~AssertHelper(&local_4c0);
        testing::Message::~Message((Message *)0x344c2d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x344c82);
      local_4d4 = 700000000;
      in_stack_fffffffffffff430 = &local_4d0;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(long *)in_stack_fffffffffffff150);
      in_stack_fffffffffffff43f =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff430);
      if (!(bool)in_stack_fffffffffffff43f) {
        testing::Message::Message(&local_4e0);
        in_stack_fffffffffffff428 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x344d2f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x398,(char *)in_stack_fffffffffffff428);
        testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
        testing::internal::AssertHelper::~AssertHelper(&local_4e8);
        testing::Message::~Message((Message *)0x344d92);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x344de7);
      testing::internal::CmpHelperSTRNE
                ((internal *)&local_4f8,"empty_factor","asset_blind_factor",local_2a8,
                 (char *)local_288._0_8_);
      in_stack_fffffffffffff427 = testing::AssertionResult::operator_cast_to_bool(&local_4f8);
      if (!(bool)in_stack_fffffffffffff427) {
        testing::Message::Message(&local_500);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x344e89);
        testing::internal::AssertHelper::AssertHelper
                  (&local_508,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x399,pcVar4);
        testing::internal::AssertHelper::operator=(&local_508,&local_500);
        testing::internal::AssertHelper::~AssertHelper(&local_508);
        testing::Message::~Message((Message *)0x344eec);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x344f41);
      in_stack_fffffffffffff400 = &local_518;
      testing::internal::CmpHelperSTRNE
                ((internal *)in_stack_fffffffffffff400,"empty_factor","value_blind_factor",local_2a8
                 ,local_290);
      in_stack_fffffffffffff40f =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff400);
      if (!(bool)in_stack_fffffffffffff40f) {
        testing::Message::Message(&local_520);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x344fe3);
        testing::internal::AssertHelper::AssertHelper
                  (&local_528,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x39a,pcVar4);
        index_00 = (uint32_t)((ulong)pcVar4 >> 0x20);
        testing::internal::AssertHelper::operator=(&local_528,&local_520);
        testing::internal::AssertHelper::~AssertHelper(&local_528);
        testing::Message::~Message((Message *)0x345046);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34509b);
      in_stack_fffffffffffff3e8 = &local_538;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffff3e8,"\"\"","issuance_txid","",local_298);
      in_stack_fffffffffffff3f7 =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff3e8);
      if (!(bool)in_stack_fffffffffffff3f7) {
        testing::Message::Message(&local_540);
        in_stack_fffffffffffff3e0 =
             (int64_t *)testing::AssertionResult::failure_message((AssertionResult *)0x34513c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_548,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x39b,(char *)in_stack_fffffffffffff3e0);
        testing::internal::AssertHelper::operator=(&local_548,&local_540);
        testing::internal::AssertHelper::~AssertHelper(&local_548);
        testing::Message::~Message((Message *)0x34519f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3451f4);
      local_55c = 0;
      pcVar4 = (char *)0x0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(uint *)in_stack_fffffffffffff150,pAVar6);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_558);
      if (!bVar3) {
        testing::Message::Message(&local_568);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3452a6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_570,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x39c,pcVar5);
        testing::internal::AssertHelper::operator=(&local_570,&local_568);
        testing::internal::AssertHelper::~AssertHelper(&local_570);
        testing::Message::~Message((Message *)0x345309);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34535e);
      local_581 = ~local_29d & 1;
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffff150,&pAVar6->success_,(type *)0x345391);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_580);
      if (!bVar3) {
        testing::Message::Message(&local_590);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_5b8,(internal *)&local_580,(AssertionResult *)"is_issuance_asset","true",
                   "false",pcVar4);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_598,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x39d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_598,&local_590);
        testing::internal::AssertHelper::~AssertHelper(&local_598);
        std::__cxx11::string::~string((string *)&local_5b8);
        testing::Message::~Message((Message *)0x34548d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x345505);
      local_5c9 = ~local_29e & 1;
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_fffffffffffff150,&pAVar6->success_,(type *)0x345538);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_5c8);
      if (!bVar3) {
        testing::Message::Message(&local_5d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_600,(internal *)&local_5c8,(AssertionResult *)"is_issuance_token","true",
                   "false",pcVar4);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_5e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x39e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
        testing::internal::AssertHelper::~AssertHelper(&local_5e0);
        std::__cxx11::string::~string((string *)&local_600);
        testing::Message::~Message((Message *)0x345634);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3456ac);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      local_288.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_288._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_290 = (char *)0x0;
      local_298 = (char *)0x0;
    }
  }
  if (local_14 == 0) {
    in_stack_fffffffffffff168 = (void **)&local_29d;
    in_stack_fffffffffffff160 = local_29c;
    in_stack_fffffffffffff158 = (char *)&local_298;
    in_stack_fffffffffffff150 = (AssertionResult *)&local_290;
    local_14 = CfdGetBlindTxBlindData
                         ((void *)CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),
                          in_stack_fffffffffffff400,index_00,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff3f7,in_stack_fffffffffffff3f0),
                          (char **)in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0,
                          (char **)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                          in_stack_fffffffffffff428,(char **)in_stack_fffffffffffff430,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff43f,in_stack_fffffffffffff438),
                          in_stack_fffffffffffff440,&in_stack_fffffffffffff448->success_);
    local_614 = 3;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_610);
    if (!bVar3) {
      testing::Message::Message(&local_620);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x345852);
      testing::internal::AssertHelper::AssertHelper
                (&local_628,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x3af,pcVar4);
      testing::internal::AssertHelper::operator=(&local_628,&local_620);
      testing::internal::AssertHelper::~AssertHelper(&local_628);
      testing::Message::~Message((Message *)0x3458b5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34590a);
    if (local_14 == 3) {
      local_14 = 0;
    }
  }
  if (local_b0 != 0) {
    CfdFreeBlindHandle((void *)CONCAT17(in_stack_fffffffffffff1df,in_stack_fffffffffffff1d8),
                       in_stack_fffffffffffff1d0);
  }
  if (local_14 == 0) {
    local_638 = (char *)0x0;
    local_640[0] = '\0';
    local_640[1] = '\0';
    local_640[2] = '\0';
    local_640[3] = '\0';
    local_640[4] = '\0';
    local_640[5] = '\0';
    local_640[6] = '\0';
    local_640[7] = '\0';
    local_648 = (void *)0x0;
    local_650 = 0;
    local_658 = 0;
    in_stack_fffffffffffff168 = &local_648;
    in_stack_fffffffffffff160 = local_640;
    in_stack_fffffffffffff158 = (char *)&local_638;
    in_stack_fffffffffffff150 = &local_288;
    puVar7 = local_630;
    local_14 = CfdUnblindIssuance(in_stack_fffffffffffff658,
                                  (char *)CONCAT17(in_stack_fffffffffffff657,
                                                   in_stack_fffffffffffff650),tx_in_index,
                                  in_stack_fffffffffffff640,
                                  (char *)CONCAT17(in_stack_fffffffffffff63f,
                                                   in_stack_fffffffffffff638),
                                  (char **)in_stack_fffffffffffff630,(int64_t *)this_01,
                                  (char **)CONCAT17(uVar2,in_stack_fffffffffffff678),
                                  in_stack_fffffffffffff680,(char **)pAVar8,
                                  (int64_t *)CONCAT17(uVar1,in_stack_fffffffffffff690),
                                  (char **)in_stack_fffffffffffff698.data_,
                                  (char **)in_stack_fffffffffffff6a0.ptr_);
    local_66c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_668);
    if (!bVar3) {
      testing::Message::Message(&local_678);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x345ac3);
      testing::internal::AssertHelper::AssertHelper
                (&local_680,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x3c6,pcVar4);
      testing::internal::AssertHelper::operator=(&local_680,&local_678);
      testing::internal::AssertHelper::~AssertHelper(&local_680);
      testing::Message::~Message((Message *)0x345b26);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x345b7b);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_690,
                 "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"","asset",
                 "accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",
                 (char *)local_288.message_.ptr_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_690);
      if (!bVar3) {
        testing::Message::Message(&local_698);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x345c2a);
        testing::internal::AssertHelper::AssertHelper
                  (&local_6a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3c8,pcVar4);
        testing::internal::AssertHelper::operator=(&local_6a0,&local_698);
        testing::internal::AssertHelper::~AssertHelper(&local_6a0);
        testing::Message::~Message((Message *)0x345c8d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x345ce2);
      local_6b4 = 600000000;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(long *)in_stack_fffffffffffff150);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_6b0);
      if (!bVar3) {
        testing::Message::Message(&local_6c0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x345d8f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_6c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3c9,pcVar4);
        testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
        testing::internal::AssertHelper::~AssertHelper(&local_6c8);
        testing::Message::~Message((Message *)0x345df2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x345e47);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_6d8,
                 "\"0000000000000000000000000000000000000000000000000000000000000000\"",
                 "asset_blind_factor",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 (char *)local_288._0_8_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_6d8);
      if (!bVar3) {
        testing::Message::Message(&local_6e0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x345ee8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff918,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3cb,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff918,&local_6e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff918);
        testing::Message::~Message((Message *)0x345f4b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x345fa0);
      testing::internal::CmpHelperSTRNE
                ((internal *)&stack0xfffffffffffff908,
                 "\"0000000000000000000000000000000000000000000000000000000000000000\"",
                 "asset_value_blind_factor",
                 "0000000000000000000000000000000000000000000000000000000000000000",local_638);
      bVar3 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffff908);
      if (!bVar3) {
        testing::Message::Message((Message *)&stack0xfffffffffffff900);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x346041);
        testing::internal::AssertHelper::AssertHelper
                  (&local_708,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3cd,pcVar4);
        testing::internal::AssertHelper::operator=(&local_708,(Message *)&stack0xfffffffffffff900);
        testing::internal::AssertHelper::~AssertHelper(&local_708);
        testing::Message::~Message((Message *)0x3460a4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3460f9);
      local_71c = 0;
      pAVar8 = &local_718;
      testing::internal::EqHelper<true>::Compare<int,long>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(long *)in_stack_fffffffffffff150,puVar7);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
      if (!bVar3) {
        testing::Message::Message(&local_728);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3461ab);
        testing::internal::AssertHelper::AssertHelper
                  (&local_730,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3d1,pcVar4);
        testing::internal::AssertHelper::operator=(&local_730,&local_728);
        testing::internal::AssertHelper::~AssertHelper(&local_730);
        testing::Message::~Message((Message *)0x34620e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x346263);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
    }
  }
  if (local_14 == 0) {
    local_288.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_288._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    in_stack_fffffffffffff150 = (AssertionResult *)&local_290;
    local_14 = CfdUnblindTxOut(in_stack_fffffffffffff488,
                               (char *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480)
                               ,tx_out_index,in_stack_fffffffffffff470,
                               (char **)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468
                                                ),(int64_t *)in_stack_fffffffffffff460,
                               (char **)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0
                                                ),in_stack_fffffffffffff4a8);
    local_744 = 0;
    pAVar8 = &local_740;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
    if (!bVar3) {
      testing::Message::Message(&local_750);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3463d7);
      testing::internal::AssertHelper::AssertHelper
                (&local_758,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x3e1,pcVar4);
      testing::internal::AssertHelper::operator=(&local_758,&local_750);
      testing::internal::AssertHelper::~AssertHelper(&local_758);
      testing::Message::~Message((Message *)0x34643a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34648f);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_768,
                 "\"186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179\"","asset",
                 "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179",
                 (char *)local_288.message_.ptr_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_768);
      if (!bVar3) {
        testing::Message::Message(&local_770);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x34653e);
        testing::internal::AssertHelper::AssertHelper
                  (&local_778,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3e3,pcVar4);
        testing::internal::AssertHelper::operator=(&local_778,&local_770);
        testing::internal::AssertHelper::~AssertHelper(&local_778);
        testing::Message::~Message((Message *)0x3465a1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3465f6);
      local_78c = 0x3b947f60;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(long *)in_stack_fffffffffffff150);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_788);
      if (!bVar3) {
        testing::Message::Message(&local_798);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3466a3);
        testing::internal::AssertHelper::AssertHelper
                  (&local_7a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3e4,pcVar4);
        testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
        testing::internal::AssertHelper::~AssertHelper(&local_7a0);
        testing::Message::~Message((Message *)0x346706);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34675b);
      testing::internal::CmpHelperSTRNE
                ((internal *)&local_7b0,
                 "\"0000000000000000000000000000000000000000000000000000000000000000\"",
                 "asset_blind_factor",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 (char *)local_288._0_8_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_7b0);
      if (!bVar3) {
        testing::Message::Message(&local_7b8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3467fc);
        testing::internal::AssertHelper::AssertHelper
                  (&local_7c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3e6,pcVar4);
        testing::internal::AssertHelper::operator=(&local_7c0,&local_7b8);
        testing::internal::AssertHelper::~AssertHelper(&local_7c0);
        testing::Message::~Message((Message *)0x34685f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3468b4);
      testing::internal::CmpHelperSTRNE
                ((internal *)&local_7d0,
                 "\"0000000000000000000000000000000000000000000000000000000000000000\"",
                 "value_blind_factor",
                 "0000000000000000000000000000000000000000000000000000000000000000",local_290);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_7d0);
      if (!bVar3) {
        testing::Message::Message(&local_7d8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x346955);
        testing::internal::AssertHelper::AssertHelper
                  (&local_7e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,999,pcVar4);
        testing::internal::AssertHelper::operator=(&local_7e0,&local_7d8);
        testing::internal::AssertHelper::~AssertHelper(&local_7e0);
        testing::Message::~Message((Message *)0x3469b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x346a0d);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      local_288.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_288._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_290 = (char *)0x0;
    }
  }
  if (local_14 == 0) {
    in_stack_fffffffffffff150 = (AssertionResult *)&local_290;
    local_14 = CfdUnblindTxOut(in_stack_fffffffffffff488,
                               (char *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480)
                               ,tx_out_index,in_stack_fffffffffffff470,
                               (char **)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468
                                                ),(int64_t *)in_stack_fffffffffffff460,
                               (char **)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0
                                                ),in_stack_fffffffffffff4a8);
    local_7f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_7f0);
    if (!bVar3) {
      testing::Message::Message(&local_800);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x346b69);
      testing::internal::AssertHelper::AssertHelper
                (&local_808,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x3f5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_808,&local_800);
      testing::internal::AssertHelper::~AssertHelper(&local_808);
      testing::Message::~Message((Message *)0x346bcc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x346c21);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_818,
                 "\"ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b\"","asset",
                 "ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b",
                 (char *)local_288.message_.ptr_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_818);
      if (!bVar3) {
        testing::Message::Message(&local_820);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x346cd0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_828,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3f7,pcVar4);
        testing::internal::AssertHelper::operator=(&local_828,&local_820);
        testing::internal::AssertHelper::~AssertHelper(&local_828);
        testing::Message::~Message((Message *)0x346d33);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x346d88);
      local_83c = 700000000;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(long *)in_stack_fffffffffffff150);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_838);
      if (!bVar3) {
        testing::Message::Message(&local_848);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x346e35);
        testing::internal::AssertHelper::AssertHelper
                  (&local_850,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3f8,pcVar4);
        testing::internal::AssertHelper::operator=(&local_850,&local_848);
        testing::internal::AssertHelper::~AssertHelper(&local_850);
        testing::Message::~Message((Message *)0x346e98);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x346eed);
      testing::internal::CmpHelperSTRNE
                ((internal *)&local_860,
                 "\"0000000000000000000000000000000000000000000000000000000000000000\"",
                 "asset_blind_factor",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 (char *)local_288._0_8_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_860);
      if (!bVar3) {
        testing::Message::Message(&local_868);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x346f8e);
        testing::internal::AssertHelper::AssertHelper
                  (&local_870,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3fa,pcVar4);
        testing::internal::AssertHelper::operator=(&local_870,&local_868);
        testing::internal::AssertHelper::~AssertHelper(&local_870);
        testing::Message::~Message((Message *)0x346ff1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x347046);
      pAVar8 = &local_880;
      testing::internal::CmpHelperSTRNE
                ((internal *)pAVar8,
                 "\"0000000000000000000000000000000000000000000000000000000000000000\"",
                 "value_blind_factor",
                 "0000000000000000000000000000000000000000000000000000000000000000",local_290);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
      if (!bVar3) {
        testing::Message::Message(&local_888);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3470e7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_890,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3fb,pcVar4);
        testing::internal::AssertHelper::operator=(&local_890,&local_888);
        testing::internal::AssertHelper::~AssertHelper(&local_890);
        testing::Message::~Message((Message *)0x34714a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34719f);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      local_288.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_288._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_290 = (char *)0x0;
    }
  }
  if (local_14 == 0) {
    in_stack_fffffffffffff150 = (AssertionResult *)&local_290;
    local_14 = CfdUnblindTxOut(in_stack_fffffffffffff488,
                               (char *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480)
                               ,tx_out_index,in_stack_fffffffffffff470,
                               (char **)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468
                                                ),(int64_t *)in_stack_fffffffffffff460,
                               (char **)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0
                                                ),in_stack_fffffffffffff4a8);
    local_8a4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
               (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_8a0);
    if (!bVar3) {
      testing::Message::Message(&local_8b0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3472fb);
      testing::internal::AssertHelper::AssertHelper
                (&local_8b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x409,pcVar4);
      testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
      testing::internal::AssertHelper::~AssertHelper(&local_8b8);
      testing::Message::~Message((Message *)0x34735e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3473b3);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffff738,
                 "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"","asset",
                 "accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",
                 (char *)local_288.message_.ptr_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffff738);
      if (!bVar3) {
        testing::Message::Message((Message *)&stack0xfffffffffffff730);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x347462);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff728,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x40b,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff728,(Message *)&stack0xfffffffffffff730);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff728);
        testing::Message::~Message((Message *)0x3474c5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34751a);
      pAVar8 = (AssertionResult *)(local_8f0 + 1);
      testing::internal::CmpHelperSTRNE
                ((internal *)pAVar8,
                 "\"0000000000000000000000000000000000000000000000000000000000000000\"",
                 "asset_blind_factor",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 (char *)local_288._0_8_);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
      if (!bVar3) {
        testing::Message::Message(local_8f0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3475bb);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff708,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x40d,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff708,local_8f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff708);
        testing::Message::~Message((Message *)0x34761e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x347673);
      testing::internal::CmpHelperSTRNE
                ((internal *)&stack0xfffffffffffff6f8,
                 "\"0000000000000000000000000000000000000000000000000000000000000000\"",
                 "value_blind_factor",
                 "0000000000000000000000000000000000000000000000000000000000000000",local_290);
      bVar3 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffff6f8);
      if (!bVar3) {
        testing::Message::Message((Message *)&stack0xfffffffffffff6f0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x347708);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff6e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x40e,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff6e8,(Message *)&stack0xfffffffffffff6f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff6e8);
        testing::Message::~Message((Message *)0x347765);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3477ba);
      local_92c = 600000000;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                 (int *)in_stack_fffffffffffff158,(long *)in_stack_fffffffffffff150);
      bVar3 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffff6d8);
      if (!bVar3) {
        testing::Message::Message(&local_938);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x34785b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_940,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x40f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_940,&local_938);
        testing::internal::AssertHelper::~AssertHelper(&local_940);
        testing::Message::~Message((Message *)0x3478b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34790d);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      CfdFreeStringBuffer(in_stack_fffffffffffff158);
      local_288.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_288._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_290 = (char *)0x0;
    }
  }
  CfdFreeStringBuffer(in_stack_fffffffffffff158);
  local_14 = CfdFreeHandle(in_stack_fffffffffffff158);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff168,in_stack_fffffffffffff160,
             (CfdErrorCode *)in_stack_fffffffffffff158,(int *)in_stack_fffffffffffff150);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_950);
  if (!bVar3) {
    testing::Message::Message((Message *)&stack0xfffffffffffff6a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x347a1e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x41c,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffff698,(Message *)&stack0xfffffffffffff6a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff698);
    testing::Message::~Message((Message *)0x347a7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x347ad0);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, BlindTransaction) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* base_tx = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  char* tx_string = nullptr;
  int64_t satoshi;
  void* blind_handle = nullptr;
  ret = CfdInitializeBlindTx(handle, &blind_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    satoshi = 999637680;
    ret = CfdAddBlindTxInData(
        handle, blind_handle,
        "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179",
        "a10ecbe1be7a5f883d5d45d966e30dbc1beff5f21c55cec76cc21a2229116a9f",
        "ae0f46d1940f297c2dc3bbd82bf8ef6931a2431fbb05b3d3bc5df41af86ae808",
        satoshi, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 700000000;
    ret = CfdAddBlindTxInData(
        handle, blind_handle,
        "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 1,
        "ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b",
        "0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8",
        "62e36e1f0fa4916b031648a6b6903083069fa587572a88b729250cde528cfd3b",
        satoshi, "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f",
        "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdAddBlindTxOutData(
        handle, blind_handle, 0,
        "02200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdAddBlindTxOutData(
        handle, blind_handle, 1,
        "02cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdAddBlindTxOutByAddress(
        handle, blind_handle,
        "CTExCoUri8VzkxbbhqzgsruWJ5zYtmoFXxCWtjiSLAzcMbpEWhHmDrZ66bAb41VsmSKnvJWrq2cfjUw9");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdSetBlindTxOption(
        handle, blind_handle, kCfdBlindOptionMinimumRangeValue, 1);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdSetBlindTxOption(
        handle, blind_handle, kCfdBlindOptionExponent, 0);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdSetBlindTxOption(
        handle, blind_handle, kCfdBlindOptionMinimumBits, 52);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdSetBlindTxOption(
        handle, blind_handle, kCfdBlindOptionCollectBlinder, 1);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdFinalizeBlindTx(handle, blind_handle, base_tx, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  uint32_t vout = 0;
  int64_t value = 0;
  char* asset = nullptr;
  char* asset_blind_factor = nullptr;
  char* value_blind_factor = nullptr;
  char* issuance_txid = nullptr;
  uint32_t issuance_vout = 0;
  bool is_issuance_asset = false;
  bool is_issuance_token = false;
  const char* empty_factor = "0000000000000000000000000000000000000000000000000000000000000000";
  if (ret == kCfdSuccess) {
    // blind is contains random value.
    // EXPECT_STREQ("", tx_string);
    ret = CfdGetBlindTxBlindData(handle, blind_handle, 0,
        &vout, &asset, &value, &asset_blind_factor,
        &value_blind_factor, &issuance_txid, &issuance_vout,
        &is_issuance_asset, &is_issuance_token);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      // reissuance: 600000000
      EXPECT_EQ(1, vout);
      EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset);
      EXPECT_EQ(600000000, value);
      EXPECT_STREQ(empty_factor, asset_blind_factor);
      EXPECT_STRNE(empty_factor, value_blind_factor);
      EXPECT_STREQ("57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",
          issuance_txid);
      EXPECT_EQ(1, issuance_vout);
      EXPECT_TRUE(is_issuance_asset);
      EXPECT_FALSE(is_issuance_token);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      CfdFreeStringBuffer(issuance_txid);
      asset = nullptr;
      asset_blind_factor = nullptr;
      value_blind_factor = nullptr;
      issuance_txid = nullptr;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetBlindTxBlindData(handle, blind_handle, 2,
        &vout, &asset, &value, &asset_blind_factor,
        &value_blind_factor, &issuance_txid, &issuance_vout,
        &is_issuance_asset, &is_issuance_token);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      // txout[1]: 700000000
      EXPECT_EQ(1, vout);
      EXPECT_STREQ("ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b", asset);
      EXPECT_EQ(700000000, value);
      EXPECT_STRNE(empty_factor, asset_blind_factor);
      EXPECT_STRNE(empty_factor, value_blind_factor);
      EXPECT_STREQ("", issuance_txid);
      EXPECT_EQ(0, issuance_vout);
      EXPECT_FALSE(is_issuance_asset);
      EXPECT_FALSE(is_issuance_token);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      CfdFreeStringBuffer(issuance_txid);
      asset = nullptr;
      asset_blind_factor = nullptr;
      value_blind_factor = nullptr;
      issuance_txid = nullptr;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetBlindTxBlindData(handle, blind_handle, 4,
        &vout, &asset, &value, &asset_blind_factor,
        &value_blind_factor, &issuance_txid, &issuance_vout,
        &is_issuance_asset, &is_issuance_token);
    EXPECT_EQ(kCfdOutOfRangeError, ret);
    if (ret == kCfdOutOfRangeError) ret = kCfdSuccess;
  }

  if (blind_handle != nullptr) {
    CfdFreeBlindHandle(handle, blind_handle);
  }

  // unblind test
  if (ret == kCfdSuccess) {
    int64_t asset_value;
    char* asset_value_blind_factor = nullptr;
    char* token = nullptr;
    int64_t token_value = 0;
    char* token_blind_factor = nullptr;
    char* token_value_blind_factor = nullptr;
    ret = CfdUnblindIssuance(
        handle, tx_string, 1,
        "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f",
        "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f",
        &asset, &asset_value, &asset_blind_factor,
        &asset_value_blind_factor, &token, &token_value,
        &token_blind_factor, &token_value_blind_factor);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset);
      EXPECT_EQ(600000000, asset_value);
      // asset is calculate from utxo txin and vout.
      EXPECT_STREQ("0000000000000000000000000000000000000000000000000000000000000000", asset_blind_factor);
      // blind factor is generate from random value.
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", asset_value_blind_factor);
      // EXPECT_STREQ("", token);
      // EXPECT_STREQ("", token_blind_factor);
      // EXPECT_STREQ("", token_value_blind_factor);
      EXPECT_EQ(0, token_value);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(asset_value_blind_factor);
      CfdFreeStringBuffer(token);
      CfdFreeStringBuffer(token_blind_factor);
      CfdFreeStringBuffer(token_value_blind_factor);
    }
  }

  if (ret == kCfdSuccess) {
    asset = nullptr;
    asset_blind_factor = nullptr;
    ret = CfdUnblindTxOut(
        handle, tx_string, 0, "6a64f506be6e60b948987aa4d180d2ab05034a6a214146e06e28d4efe101d006",
        &asset, &value, &asset_blind_factor, &value_blind_factor);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179", asset);
      EXPECT_EQ(999587680, value);
      // blind factor is generate from random value.
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", asset_blind_factor);
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", value_blind_factor);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      asset = nullptr;
      asset_blind_factor = nullptr;
      value_blind_factor = nullptr;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdUnblindTxOut(
        handle, tx_string, 1, "94c85164605f589c4c572874f36b8301989c7fabfd44131297e95824d473681f",
        &asset, &value, &asset_blind_factor, &value_blind_factor);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b", asset);
      EXPECT_EQ(700000000, value);
      // blind factor is generate from random value.
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", asset_blind_factor);
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", value_blind_factor);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      asset = nullptr;
      asset_blind_factor = nullptr;
      value_blind_factor = nullptr;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdUnblindTxOut(
        handle, tx_string, 3, "0473d39aa6542e0c1bb6a2343b2319c3e92063dd019af4d47dbf50c460204f32",
        &asset, &value, &asset_blind_factor, &value_blind_factor);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset);
      // blind factor is generate from random value.
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", asset_blind_factor);
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", value_blind_factor);
      EXPECT_EQ(600000000, value);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      asset = nullptr;
      asset_blind_factor = nullptr;
      value_blind_factor = nullptr;
    }
  }

  CfdFreeStringBuffer(tx_string);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}